

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.cpp
# Opt level: O0

size_t __thiscall Js::Utf8SourceInfo::GetCbLength(Utf8SourceInfo *this,char16 *reason)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  ISourceHolder **ppIVar4;
  undefined4 *puVar5;
  uchar **ppuVar6;
  ISourceHolder *pIVar7;
  undefined4 extraout_var;
  char16_t *local_38;
  char16 *reason_local;
  Utf8SourceInfo *this_local;
  
  ppIVar4 = Memory::WriteBarrierPtr::operator_cast_to_ISourceHolder__
                      ((WriteBarrierPtr *)&this->sourceHolder);
  if (*ppIVar4 == (ISourceHolder *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/Utf8SourceInfo.cpp"
                                ,0x4e,"(this->sourceHolder != nullptr)","We have no source mapper.")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = IsInDebugMode(this);
  if (bVar2) {
    ppuVar6 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                        ((WriteBarrierPtr *)&this->debugModeSource);
    if ((*ppuVar6 == (uchar *)0x0) && (((byte)this->field_0xa8 >> 5 & 1) == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/Utf8SourceInfo.cpp"
                                  ,0x52,
                                  "(this->debugModeSource != nullptr || this->debugModeSourceIsEmpty)"
                                  ,"Debug mode source should have been set by this point.");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    this_local = (Utf8SourceInfo *)this->debugModeSourceLength;
  }
  else {
    pIVar7 = Memory::WriteBarrierPtr<Js::ISourceHolder>::operator->(&this->sourceHolder);
    local_38 = reason;
    if (reason == (char16 *)0x0) {
      local_38 = L"Utf8SourceInfo::GetSource";
    }
    iVar3 = (*(pIVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[7])(pIVar7,local_38);
    this_local = (Utf8SourceInfo *)CONCAT44(extraout_var,iVar3);
  }
  return (size_t)this_local;
}

Assistant:

size_t Utf8SourceInfo::GetCbLength(const char16 * reason) const
    {
        AssertMsg(this->sourceHolder != nullptr, "We have no source mapper.");
#ifdef ENABLE_SCRIPT_DEBUGGING
        if (this->IsInDebugMode())
        {
            AssertMsg(this->debugModeSource != nullptr || this->debugModeSourceIsEmpty, "Debug mode source should have been set by this point.");
            return debugModeSourceLength;
        }
        else
#endif
        {
            return sourceHolder->GetByteLength(reason == nullptr ? _u("Utf8SourceInfo::GetSource") : reason);
        }
    }